

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bonk~.c
# Opt level: O0

void bonk_mask(t_bonk *x,t_floatarg f1,t_floatarg f2)

{
  int local_1c;
  t_float local_18;
  int ticks;
  t_floatarg f2_local;
  t_floatarg f1_local;
  t_bonk *x_local;
  
  local_1c = (int)f1;
  if (local_1c < 0) {
    local_1c = 0;
  }
  if (0.0 <= f2) {
    local_18 = f2;
    if (1.0 < f2) {
      local_18 = 1.0;
    }
  }
  else {
    local_18 = 0.0;
  }
  x->x_masktime = local_1c;
  x->x_maskdecay = local_18;
  return;
}

Assistant:

static void bonk_mask(t_bonk *x, t_floatarg f1, t_floatarg f2)
{
    int ticks = f1;
    if (ticks < 0) ticks = 0;
    if (f2 < 0) f2 = 0;
    else if (f2 > 1) f2 = 1;
    x->x_masktime = ticks;
    x->x_maskdecay = f2;
}